

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O0

void __thiscall
adios2::EVPathRemote::OpenSimpleFile
          (EVPathRemote *this,string *hostname,int32_t port,string *filename)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  int in_EDX;
  EVPathRemote *in_RSI;
  long in_RDI;
  atom_t CM_IP_HOSTNAME;
  atom_t CM_IP_PORT;
  attr_list contact_list;
  _OpenSimpleFileMsg open_msg;
  undefined4 local_30 [2];
  undefined8 local_28;
  int local_14;
  
  local_14 = in_EDX;
  InitCMData(in_RSI);
  uVar3 = create_attr_list();
  uVar1 = attr_atom_from_string("IP_HOST");
  uVar2 = attr_atom_from_string("IP_PORT");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  pcVar4 = strdup(pcVar4);
  add_attr(uVar3,uVar1,3,pcVar4);
  add_attr(uVar3,uVar2,1,(long)local_14);
  uVar5 = CMinitiate_conn(*(undefined8 *)(in_RDI + 0xa0));
  *(undefined8 *)(in_RDI + 0x108) = uVar5;
  free_attr_list(uVar3);
  if (*(long *)(in_RDI + 0x108) != 0) {
    memset(local_30,0,0x10);
    local_28 = std::__cxx11::string::c_str();
    local_30[0] = CMCondition_get(*(undefined8 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x108));
    CMCondition_set_client_data(*(undefined8 *)(in_RDI + 0xa0),local_30[0]);
    CMwrite(*(undefined8 *)(in_RDI + 0x108),*(undefined8 *)(in_RDI + 0xb0),local_30);
    CMCondition_wait(*(undefined8 *)(in_RDI + 0xa0),local_30[0]);
    *(undefined1 *)(in_RDI + 0x138) = 1;
  }
  return;
}

Assistant:

void EVPathRemote::OpenSimpleFile(const std::string hostname, const int32_t port,
                                  const std::string filename)
{

    EVPathRemoteCommon::_OpenSimpleFileMsg open_msg;
    InitCMData();
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)strdup(hostname.c_str()));
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)port);
    m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    free_attr_list(contact_list);
    if (!m_conn)
        return;

    memset(&open_msg, 0, sizeof(open_msg));
    open_msg.FileName = (char *)filename.c_str();
    open_msg.OpenResponseCondition = CMCondition_get(ev_state.cm, m_conn);
    CMCondition_set_client_data(ev_state.cm, open_msg.OpenResponseCondition, (void *)this);
    CMwrite(m_conn, ev_state.OpenSimpleFileFormat, &open_msg);
    CMCondition_wait(ev_state.cm, open_msg.OpenResponseCondition);
    m_Active = true;
}